

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

int pzshape::TPZShapeTetra::NConnectShapeF(int side,int order)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  int in_EDI;
  int i_1;
  int sum_1;
  int totsum;
  int i;
  int sum;
  int local_20;
  int local_18;
  int local_14;
  int local_10;
  int local_4;
  
  if (in_EDI < 4) {
    local_4 = 1;
  }
  else if (in_EDI < 10) {
    local_4 = in_ESI + -1;
  }
  else if (in_EDI < 0xe) {
    local_10 = 0;
    for (local_14 = 0; local_14 < in_ESI + -1; local_14 = local_14 + 1) {
      local_10 = local_14 + local_10;
    }
    local_4 = local_10;
  }
  else if (in_EDI == 0xe) {
    local_18 = 0;
    for (local_20 = 1; local_20 < in_ESI + -2; local_20 = local_20 + 1) {
      local_18 = (local_20 * (local_20 + 1)) / 2 + local_18;
    }
    local_4 = local_18;
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"TPZCompElT3d::NConnectShapeF, bad parameter side "
                          );
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZShapeTetra::NConnectShapeF(int side, int order) {
		if(side<4) return 1;//0 a 3
		//   int s = side-4;
		if(side<10) return order-1;//4 a 9
		if(side<14) {//10 a 13
			int sum = 0;
			for(int i=0;i<order-1;i++) sum += i;
			return sum;
		}
		if(side==14) {
			int totsum = 0,sum;
			for(int i=1;i<order-2;i++) {
				sum = i*(i+1) / 2;
				totsum += sum;
			}
			return totsum;
		}
		PZError << "TPZCompElT3d::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}